

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_allocator.h
# Opt level: O0

StackTrace * __thiscall
tcmalloc::PageHeapAllocator<tcmalloc::StackTrace>::New
          (PageHeapAllocator<tcmalloc::StackTrace> *this)

{
  LogItem b;
  LogItem c;
  LogItem d;
  char *pcVar1;
  LogItem a;
  LogItem local_58;
  LogItem local_48;
  LogItem local_38;
  LogItem local_28;
  StackTrace *local_18;
  void *result;
  PageHeapAllocator<tcmalloc::StackTrace> *this_local;
  
  if (this->free_list_ == (void *)0x0) {
    if (this->free_avail_ < 0x108) {
      result = this;
      pcVar1 = (char *)MetaDataAlloc(0x20000);
      this->free_area_ = pcVar1;
      if (this->free_area_ == (char *)0x0) {
        LogItem::LogItem(&local_28,
                         "FATAL ERROR: Out of memory trying to allocate internal tcmalloc data (bytes, object-size)"
                        );
        LogItem::LogItem(&local_38,0x20000);
        LogItem::LogItem(&local_48,0x108);
        LogItem::LogItem(&local_58);
        a._4_4_ = 0;
        a.tag_ = local_28.tag_;
        b.u_.str = local_38.u_.str;
        b.tag_ = local_38.tag_;
        b._4_4_ = local_38._4_4_;
        c.u_.str = local_48.u_.str;
        c.tag_ = local_48.tag_;
        c._4_4_ = local_48._4_4_;
        d.u_.str = local_58.u_.str;
        d.tag_ = local_58.tag_;
        d._4_4_ = local_58._4_4_;
        a.u_.str = local_28.u_.str;
        Log(kCrash,
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap_allocator.h"
            ,0x4c,a,b,c,d);
      }
      this->free_avail_ = 0x20000;
    }
    local_18 = (StackTrace *)this->free_area_;
    this->free_area_ = this->free_area_ + 0x108;
    this->free_avail_ = this->free_avail_ - 0x108;
  }
  else {
    local_18 = (StackTrace *)this->free_list_;
    this->free_list_ = (void *)local_18->size;
  }
  this->inuse_ = this->inuse_ + 1;
  return local_18;
}

Assistant:

T* New() {
    // Consult free list
    void* result;
    if (free_list_ != nullptr) {
      result = free_list_;
      free_list_ = *(reinterpret_cast<void**>(result));
    } else {
      if (free_avail_ < sizeof(T)) {
        // Need more room. We assume that MetaDataAlloc returns
        // suitably aligned memory.
        free_area_ = reinterpret_cast<char*>(MetaDataAlloc(kAllocIncrement));
        if (free_area_ == nullptr) {
          Log(kCrash, __FILE__, __LINE__,
              "FATAL ERROR: Out of memory trying to allocate internal "
              "tcmalloc data (bytes, object-size)",
              kAllocIncrement, sizeof(T));
        }
        free_avail_ = kAllocIncrement;
      }
      result = free_area_;
      free_area_ += sizeof(T);
      free_avail_ -= sizeof(T);
    }
    inuse_++;
    return reinterpret_cast<T*>(result);
  }